

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O0

TransactionController * __thiscall
cfd::api::TransactionApi::CreateRawTransaction
          (TransactionApi *this,uint32_t version,uint32_t locktime,
          vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *txins,
          vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *txouts)

{
  undefined8 uVar1;
  uint in_EDX;
  CfdException *in_RSI;
  TransactionController *in_RDI;
  TransactionController txc;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *in_stack_00000250;
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *in_stack_00000258;
  string *in_stack_00000260;
  TransactionApi *in_stack_00000268;
  AbstractTransactionController *this_00;
  TransactionController *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  allocator *paVar2;
  TransactionController *pTVar3;
  CfdError error_code;
  string local_e8 [32];
  AbstractTransactionController local_c8 [5];
  undefined1 local_75;
  allocator local_61;
  string local_60 [32];
  CfdSourceLocation local_40;
  uint local_14 [5];
  
  if (4 < in_EDX) {
    pTVar3 = in_RDI;
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
                 ,0x2f);
    error_code = (CfdError)((ulong)pTVar3 >> 0x20);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x46;
    local_40.funcname = "CreateRawTransaction";
    core::logger::warn<unsigned_int&>
              (&local_40,"Failed to CreateRawTransaction. invalid version number: version={}",
               local_14);
    local_75 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    paVar2 = &local_61;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_60,"Invalid version number. We supports only 1, 2, 3, or 4:",paVar2);
    core::CfdException::CfdException(in_RSI,error_code,(string *)in_RDI);
    local_75 = 0;
    __cxa_throw(uVar1,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  this_00 = local_c8;
  TransactionController::TransactionController
            (in_RDI,(uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffef8);
  AbstractTransactionController::GetHex_abi_cxx11_(this_00);
  AddRawTransaction(in_stack_00000268,in_stack_00000260,in_stack_00000258,in_stack_00000250);
  std::__cxx11::string::~string(local_e8);
  TransactionController::~TransactionController(in_stack_fffffffffffffef0);
  return in_RDI;
}

Assistant:

TransactionController TransactionApi::CreateRawTransaction(
    uint32_t version, uint32_t locktime, const std::vector<TxIn>& txins,
    const std::vector<TxOut>& txouts) const {
  if (4 < version) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to CreateRawTransaction. invalid version number: version={}",  // NOLINT
        version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid version number. We supports only 1, 2, 3, or 4:");
  }

  TransactionController txc(version, locktime);
  return AddRawTransaction(txc.GetHex(), txins, txouts);
}